

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

Value * __thiscall cmGlobalGenerator::GetJson(Value *__return_storage_ptr__,cmGlobalGenerator *this)

{
  int iVar1;
  Value *pVVar2;
  Value local_a0;
  String local_68;
  Value local_48;
  undefined1 local_19;
  cmGlobalGenerator *local_18;
  cmGlobalGenerator *this_local;
  Value *generator;
  
  local_19 = 0;
  local_18 = this;
  this_local = (cmGlobalGenerator *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  (*this->_vptr_cmGlobalGenerator[3])(&local_68);
  Json::Value::Value(&local_48,&local_68);
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"name");
  Json::Value::operator=(pVVar2,&local_48);
  Json::Value::~Value(&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  iVar1 = (*this->_vptr_cmGlobalGenerator[0x26])();
  Json::Value::Value(&local_a0,(bool)((byte)iVar1 & 1));
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"multiConfig");
  Json::Value::operator=(pVVar2,&local_a0);
  Json::Value::~Value(&local_a0);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmGlobalGenerator::GetJson() const
{
  Json::Value generator = Json::objectValue;
  generator["name"] = this->GetName();
  generator["multiConfig"] = this->IsMultiConfig();
  return generator;
}